

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  SegmentBuilder *pSVar4;
  CapTableBuilder *pCVar5;
  StructPointerCount SVar6;
  undefined1 uVar7;
  ListElementCount LVar8;
  BitsPerElementN<23> BVar9;
  undefined8 uVar10;
  ElementSize EVar11;
  Which WVar12;
  StructSize elementSize;
  StructSchema SVar13;
  ulong uVar14;
  EnumSchema EVar15;
  InterfaceSchema IVar16;
  ListBuilder *__return_storage_ptr___00;
  Type TVar17;
  ArrayPtr<unsigned_char> AVar18;
  Schema in_stack_fffffffffffffee8;
  Fault f;
  undefined1 local_e8 [16];
  ListSchema elementType;
  Builder local_c0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  
  if ((this->builder).elementCount <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x448,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  WVar12 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar12 = (this->schema).elementType.baseType;
  }
  switch(WVar12) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->builder).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar14 = (ulong)(char)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_00437ca5;
  case INT16:
    uVar14 = (ulong)*(short *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00437ca5;
  case INT32:
    uVar14 = (ulong)*(int *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
                            );
    goto LAB_00437ca5;
  case INT64:
    uVar14 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00437ca5:
    __return_storage_ptr__->type = INT;
LAB_00437d43:
    (__return_storage_ptr__->field_1).intValue = uVar14;
    break;
  case UINT8:
    uVar14 = (ulong)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_00437d3d;
  case UINT16:
    uVar14 = (ulong)*(ushort *)
                     ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00437d3d;
  case UINT32:
    uVar14 = (ulong)*(uint *)((this->builder).ptr +
                             ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00437d3d;
  case UINT64:
    uVar14 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00437d3d:
    __return_storage_ptr__->type = UINT;
    goto LAB_00437d43;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_00437d1b;
  case FLOAT64:
    dVar1 = *(double *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_00437d1b:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    f.exception = (Exception *)(this->builder).segment;
    capnp::_::PointerBuilder::getBlob<capnp::Text>(&local_c0,(PointerBuilder *)&f,(void *)0x0,0);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_c0.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_c0._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_c0.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    f.exception = (Exception *)(this->builder).segment;
    AVar18 = (ArrayPtr<unsigned_char>)
             capnp::_::PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar18;
    break;
  case LIST:
    TVar17 = (Type)Type::asList((Type *)this);
    elementType.elementType = TVar17;
    if (TVar17.baseType == STRUCT &&
        ((undefined1  [16])TVar17 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      f.exception = (Exception *)(this->builder).segment;
      Type::asStruct(&elementType.elementType);
      elementSize = anon_unknown_71::structSizeFromSchema
                              ((StructSchema)in_stack_fffffffffffffee8.raw);
      __return_storage_ptr___00 = &local_58;
      capnp::_::PointerBuilder::getStructList
                (__return_storage_ptr___00,(PointerBuilder *)&f,elementSize,(word *)0x0);
    }
    else {
      f.exception = (Exception *)(this->builder).segment;
      WVar12 = LIST;
      if (((undefined1  [16])TVar17 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        WVar12 = TVar17.baseType;
      }
      EVar11 = anon_unknown_71::elementSizeFor(WVar12);
      __return_storage_ptr___00 = &local_80;
      capnp::_::PointerBuilder::getList
                (__return_storage_ptr___00,(PointerBuilder *)&f,EVar11,(word *)0x0);
    }
    SVar6 = __return_storage_ptr___00->structPointerCount;
    EVar11 = __return_storage_ptr___00->elementSize;
    uVar7 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar6;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar11;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar7;
    pSVar4 = __return_storage_ptr___00->segment;
    pCVar5 = __return_storage_ptr___00->capTable;
    LVar8 = __return_storage_ptr___00->elementCount;
    BVar9 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar8;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar9;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar4;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar5;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar17;
    break;
  case ENUM:
    EVar15 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3))
    ;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar15.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar13 = Type::asStruct((Type *)this);
    capnp::_::ListBuilder::getStructElement(&local_a8,&this->builder,index);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a8._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a8.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a8.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a8.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a8.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar13.super_Schema.raw;
    break;
  case INTERFACE:
    IVar16 = Type::asInterface((Type *)this);
    elementType.elementType = *(Type *)&this->builder;
    capnp::_::PointerBuilder::getCapability((PointerBuilder *)local_e8);
    uVar10 = local_e8._8_8_;
    f.exception = (Exception *)local_e8._0_8_;
    local_e8._8_8_ = (ClientHook *)0x0;
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)local_e8._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)uVar10;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar16.super_Schema.raw;
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)local_e8);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x47b,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&f);
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}